

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuCreate.c
# Opt level: O1

Fxu_Matrix * Fxu_CreateMatrix(Fxu_Data_t *pData)

{
  char *pcVar1;
  int iVar2;
  void *pvVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Fxu_Matrix *p;
  Fxu_Var **ppFVar9;
  Fxu_Var *pFVar10;
  Fxu_Pair ***pppFVar11;
  Fxu_Pair **__s;
  int *__base;
  Fxu_Cube *pFVar12;
  long lVar13;
  uint uVar14;
  Fxu_Cube *pCube1;
  int i;
  long lVar15;
  ulong uVar16;
  uint nPairsTotal;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  
  if (pData->nNodesOld < 1) {
    uVar18 = 0;
    uVar7 = 0xffffffff;
    nPairsTotal = 0;
    uVar14 = 0;
  }
  else {
    uVar7 = 0xffffffff;
    lVar20 = 0;
    uVar14 = 0;
    nPairsTotal = 0;
    uVar18 = 0;
    do {
      pcVar17 = (char *)pData->vSops->pArray[lVar20];
      if (pcVar17 != (char *)0x0) {
        iVar4 = Abc_SopGetCubeNum(pcVar17);
        uVar5 = Abc_SopGetVarNum(pcVar17);
        if (((int)uVar5 < 2) || (iVar4 < 1)) {
          __assert_fail("nFanins > 1 && nCubes > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                        ,0x50,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
        }
        uVar18 = uVar18 + iVar4;
        nPairsTotal = nPairsTotal + ((uint)((iVar4 + -1) * iVar4) >> 1);
        uVar14 = iVar4 * iVar4 + uVar14;
        if ((int)uVar7 <= (int)uVar5) {
          uVar7 = uVar5;
        }
      }
      lVar20 = lVar20 + 1;
    } while (lVar20 < pData->nNodesOld);
  }
  if ((int)uVar7 < 1) {
    pcVar17 = "The current network does not have SOPs to perform extraction.";
  }
  else {
    if (50000000 < (int)uVar14) {
      printf("The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n",
             (ulong)uVar18);
      return (Fxu_Matrix *)0x0;
    }
    p = Fxu_MatrixAllocate();
    ppFVar9 = (Fxu_Var **)malloc(((long)pData->nNodesExt + (long)pData->nNodesOld) * 0x10);
    p->ppVars = ppFVar9;
    if (0 < pData->nNodesOld) {
      lVar20 = 0;
      do {
        pFVar10 = Fxu_MatrixAddVar(p);
        p->ppVars[lVar20] = pFVar10;
        lVar20 = lVar20 + 1;
      } while (SBORROW8(lVar20,(long)pData->nNodesOld * 2) !=
               lVar20 + (long)pData->nNodesOld * -2 < 0);
    }
    pppFVar11 = (Fxu_Pair ***)malloc((ulong)uVar18 * 8 + 800);
    p->pppPairs = pppFVar11;
    __s = (Fxu_Pair **)malloc((ulong)uVar14 * 8 + 800);
    p->ppPairs = __s;
    memset(__s,0,(ulong)uVar14 * 8);
    uVar5 = 0;
    uVar19 = 0;
    if (0 < pData->nNodesOld) {
      lVar20 = 0;
      uVar5 = 0;
      uVar19 = 0;
      do {
        pcVar17 = (char *)pData->vSops->pArray[lVar20];
        if (pcVar17 != (char *)0x0) {
          uVar6 = Abc_SopGetCubeNum(pcVar17);
          pFVar10 = p->ppVars[lVar20 * 2 + 1];
          pFVar10->nCubes = uVar6;
          if (0 < (int)uVar6) {
            pppFVar11 = p->pppPairs;
            pFVar10->ppPairs = pppFVar11 + (int)uVar19;
            pppFVar11[(int)uVar19] = p->ppPairs + (int)uVar5;
            if (uVar6 != 1) {
              uVar16 = 1;
              do {
                pFVar10->ppPairs[uVar16] = pFVar10->ppPairs[uVar16 - 1] + uVar6;
                uVar16 = uVar16 + 1;
              } while (uVar6 != uVar16);
            }
          }
          uVar19 = uVar19 + uVar6;
          uVar5 = uVar5 + uVar6 * uVar6;
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < pData->nNodesOld);
    }
    if (uVar19 != uVar18) {
      __assert_fail("iCube == nCubesTotal",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                    ,0x85,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
    }
    if (uVar5 != uVar14) {
      __assert_fail("iPair == nPairsStore",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                    ,0x86,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
    }
    __base = (int *)malloc((ulong)uVar7 << 2);
    if (0 < pData->nNodesOld) {
      lVar20 = 0;
      do {
        pcVar17 = (char *)pData->vSops->pArray[lVar20];
        if (pcVar17 != (char *)0x0) {
          pFVar10 = p->ppVars[lVar20 * 2 + 1];
          pvVar3 = pData->vFanins->pArray[lVar20];
          s_pLits = *(int **)((long)pvVar3 + 8);
          uVar7 = Abc_SopGetVarNum(pcVar17);
          if (0 < (int)uVar7) {
            uVar16 = 0;
            do {
              __base[uVar16] = (int)uVar16;
              uVar16 = uVar16 + 1;
            } while (uVar7 != uVar16);
          }
          qsort(__base,(long)(int)uVar7,4,Fxu_CreateMatrixLitCompare);
          if (s_pLits[__base[(long)(int)uVar7 - 1]] <= s_pLits[*__base]) {
            __assert_fail("s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ]",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fxu/fxuCreate.c"
                          ,0x9c,"Fxu_Matrix *Fxu_CreateMatrix(Fxu_Data_t *)");
          }
          if (*pcVar17 == '\0') {
            pCube1 = (Fxu_Cube *)0x0;
          }
          else {
            pCube1 = (Fxu_Cube *)0x0;
            iVar4 = 0;
            do {
              pFVar12 = Fxu_MatrixAddCube(p,pFVar10,iVar4);
              for (lVar15 = 0; (pcVar17[lVar15] & 0xdfU) != 0; lVar15 = lVar15 + 1) {
                lVar13 = (long)__base[lVar15];
                if (pcVar17[lVar13] == '1') {
                  iVar8 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar13 * 4) * 2;
LAB_00452ca2:
                  Fxu_MatrixAddLiteral(p,pFVar12,p->ppVars[iVar8]);
                }
                else if (pcVar17[lVar13] == '0') {
                  iVar8 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar13 * 4) * 2 + 1;
                  goto LAB_00452ca2;
                }
              }
              if (pCube1 == (Fxu_Cube *)0x0) {
                pCube1 = pFVar12;
              }
              pFVar12->pFirst = pCube1;
              pcVar1 = pcVar17 + (int)(uVar7 + 3);
              pcVar17 = pcVar17 + (int)(uVar7 + 3);
              iVar4 = iVar4 + 1;
            } while (*pcVar1 != '\0');
          }
          pFVar10->pFirst = pCube1;
          if ((int)nPairsTotal <= pData->nPairsMax) {
            for (; pCube1 != (Fxu_Cube *)0x0; pCube1 = pCube1->pNext) {
              for (pFVar12 = pCube1->pNext; pFVar12 != (Fxu_Cube *)0x0; pFVar12 = pFVar12->pNext) {
                Fxu_MatrixAddDivisor(p,pCube1,pFVar12);
              }
            }
          }
        }
        lVar20 = lVar20 + 1;
      } while (lVar20 < pData->nNodesOld);
    }
    if (__base != (int *)0x0) {
      free(__base);
    }
    if ((int)nPairsTotal < 0x989681) {
      if ((pData->nPairsMax < (int)nPairsTotal) &&
         (iVar4 = Fxu_PreprocessCubePairs(p,pData->vSops,nPairsTotal,pData->nPairsMax), iVar4 == 0))
      {
        return (Fxu_Matrix *)0x0;
      }
      if ((p->lVars).nItems < 0xf4241) {
        Fxu_MatrixComputeSingles(p,pData->fUse0,pData->nSingleMax);
        if (pData->fVerbose != 0) {
          iVar4 = p->nEntries;
          iVar8 = (p->lCubes).nItems;
          iVar2 = (p->lVars).nItems;
          fprintf(_stdout,"Matrix: [vars x cubes] = [%d x %d]  ");
          fprintf(_stdout,"Lits = %d  Density = %.5f%%\n",
                  ((double)iVar4 / (double)iVar2) / (double)iVar8,(ulong)(uint)p->nEntries);
          fprintf(_stdout,"1-cube divs = %6d. (Total = %6d)  ",(ulong)(uint)(p->lSingles).nItems,
                  (ulong)(uint)p->nSingleTotal);
          fprintf(_stdout,"2-cube divs = %6d. (Total = %6d)",(ulong)(uint)p->nDivsTotal,
                  (ulong)nPairsTotal);
          fputc(10,_stdout);
          return p;
        }
        return p;
      }
      pcVar17 = "The total number of variables is more than 1,000,000.";
    }
    else {
      pcVar17 = "The total number of cube pairs of the network is more than 10,000,000.";
    }
    puts(pcVar17);
    puts("Command \"fx\" takes a long time to run in such cases. It is suggested");
    puts("that the user changes the network by reducing the size of logic node and");
    puts("consequently the number of cube pairs to be processed by this command.");
    puts("It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"");
    pcVar17 = "as a proprocessing step, while selecting <num> as approapriate.";
  }
  puts(pcVar17);
  return (Fxu_Matrix *)0x0;
}

Assistant:

Fxu_Matrix * Fxu_CreateMatrix( Fxu_Data_t * pData )
{
    Fxu_Matrix * p;
    Fxu_Var * pVar;
    Fxu_Cube * pCubeFirst, * pCubeNew;
    Fxu_Cube * pCube1, * pCube2;
    Vec_Int_t * vFanins;
    char * pSopCover;
    char * pSopCube;
    int * pOrder, nBitsMax;
    int i, v, c;
    int nCubesTotal;
    int nPairsTotal;
    int nPairsStore;
    int nCubes;
    int iCube, iPair;
    int nFanins;

    // collect all sorts of statistics
    nCubesTotal =  0;
    nPairsTotal =  0;
    nPairsStore =  0;
    nBitsMax    = -1; 
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            nCubes       = Abc_SopGetCubeNum( pSopCover );
            nFanins      = Abc_SopGetVarNum( pSopCover );
            assert( nFanins > 1 && nCubes > 0 );

            nCubesTotal += nCubes;
            nPairsTotal += nCubes * (nCubes - 1) / 2;
            nPairsStore += nCubes * nCubes;
            if ( nBitsMax < nFanins )
                nBitsMax = nFanins;
        }
    if ( nBitsMax <= 0 )
    {
        printf( "The current network does not have SOPs to perform extraction.\n" );
        return NULL;
    }

    if ( nPairsStore > 50000000 )
    {
        printf( "The problem is too large to be solved by \"fxu\" (%d cubes and %d cube pairs)\n", nCubesTotal, nPairsStore );
        return NULL;
    }

    // start the matrix
	p = Fxu_MatrixAllocate();
    // create the column labels 
    p->ppVars = ABC_ALLOC( Fxu_Var *, 2 * (pData->nNodesOld + pData->nNodesExt) );
    for ( i = 0; i < 2 * pData->nNodesOld; i++ )
        p->ppVars[i] = Fxu_MatrixAddVar( p );

    // allocate storage for all cube pairs at once
    p->pppPairs = ABC_ALLOC( Fxu_Pair **, nCubesTotal + 100 );
    p->ppPairs  = ABC_ALLOC( Fxu_Pair *,  nPairsStore + 100 );
    memset( p->ppPairs, 0, sizeof(Fxu_Pair *) * nPairsStore );
    iCube = 0;
    iPair = 0;
    for ( i = 0; i < pData->nNodesOld; i++ )
        if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
        {
            // get the number of cubes
            nCubes = Abc_SopGetCubeNum( pSopCover );
            // get the new var in the matrix
            pVar = p->ppVars[2*i+1];
            // assign the pair storage
            pVar->nCubes     = nCubes;
            if ( nCubes > 0 )
            {
                pVar->ppPairs    = p->pppPairs + iCube;
                pVar->ppPairs[0] = p->ppPairs  + iPair;
                for ( v = 1; v < nCubes; v++ )
                    pVar->ppPairs[v] = pVar->ppPairs[v-1] + nCubes;
            }
            // update
            iCube += nCubes;
            iPair += nCubes * nCubes;
        }
    assert( iCube == nCubesTotal );
    assert( iPair == nPairsStore );


    // allocate room for the reordered literals
    pOrder = ABC_ALLOC( int, nBitsMax );
    // create the rows
    for ( i = 0; i < pData->nNodesOld; i++ )
    if ( (pSopCover = (char *)pData->vSops->pArray[i]) )
    {
        // get the new var in the matrix
        pVar = p->ppVars[2*i+1];
        // here we sort the literals of the cover
        // in the increasing order of the numbers of the corresponding nodes
        // because literals should be added to the matrix in this order
        vFanins = (Vec_Int_t *)pData->vFanins->pArray[i];
        s_pLits = vFanins->pArray;
        // start the variable order
        nFanins = Abc_SopGetVarNum( pSopCover );
        for ( v = 0; v < nFanins; v++ )
            pOrder[v] = v;
        // reorder the fanins
        qsort( (void *)pOrder, nFanins, sizeof(int),(int (*)(const void *, const void *))Fxu_CreateMatrixLitCompare);
        assert( s_pLits[ pOrder[0] ] < s_pLits[ pOrder[nFanins-1] ] );
        // create the corresponding cubes in the matrix
        pCubeFirst = NULL;
        c = 0;
        Abc_SopForEachCube( pSopCover, nFanins, pSopCube )
        {
            // create the cube
	        pCubeNew = Fxu_MatrixAddCube( p, pVar, c++ );
            Fxu_CreateMatrixAddCube( p, pCubeNew, pSopCube, vFanins, pOrder );
            if ( pCubeFirst == NULL )
                pCubeFirst = pCubeNew;
            pCubeNew->pFirst = pCubeFirst;
        }
        // set the first cube of this var
        pVar->pFirst = pCubeFirst;
        // create the divisors without preprocessing
        if ( nPairsTotal <= pData->nPairsMax )
        {
		    for ( pCube1 = pCubeFirst; pCube1; pCube1 = pCube1->pNext )
			    for ( pCube2 = pCube1? pCube1->pNext: NULL; pCube2; pCube2 = pCube2->pNext )
				    Fxu_MatrixAddDivisor( p, pCube1, pCube2 );
        }
    }
    ABC_FREE( pOrder );

    // consider the case when cube pairs should be preprocessed
    // before adding them to the set of divisors
//    if ( pData->fVerbose )
//        printf( "The total number of cube pairs is %d.\n", nPairsTotal );
    if ( nPairsTotal > 10000000 )
    {
        printf( "The total number of cube pairs of the network is more than 10,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }
    if ( nPairsTotal > pData->nPairsMax )
        if ( !Fxu_PreprocessCubePairs( p, pData->vSops, nPairsTotal, pData->nPairsMax ) )
            return NULL;
//    if ( pData->fVerbose )
//        printf( "Only %d best cube pairs will be used by the fast extract command.\n", pData->nPairsMax );

    if ( p->lVars.nItems > 1000000 )
    {
        printf( "The total number of variables is more than 1,000,000.\n" );
        printf( "Command \"fx\" takes a long time to run in such cases. It is suggested\n" );
        printf( "that the user changes the network by reducing the size of logic node and\n" );
        printf( "consequently the number of cube pairs to be processed by this command.\n" );
        printf( "It can be achieved as follows: \"st; if -K <num>\" or \"st; renode -s -K <num>\"\n" );
        printf( "as a proprocessing step, while selecting <num> as approapriate.\n" );
        return NULL;
    }


    // add the var pairs to the heap
    Fxu_MatrixComputeSingles( p, pData->fUse0, pData->nSingleMax );

    // print stats
    if ( pData->fVerbose )
    {
        double Density;
        Density = ((double)p->nEntries) / p->lVars.nItems / p->lCubes.nItems;
	    fprintf( stdout, "Matrix: [vars x cubes] = [%d x %d]  ",
            p->lVars.nItems, p->lCubes.nItems );
	    fprintf( stdout, "Lits = %d  Density = %.5f%%\n", 
            p->nEntries, Density );
	    fprintf( stdout, "1-cube divs = %6d. (Total = %6d)  ",  p->lSingles.nItems, p->nSingleTotal );
	    fprintf( stdout, "2-cube divs = %6d. (Total = %6d)",  p->nDivsTotal, nPairsTotal );
	    fprintf( stdout, "\n" );
    }
//    Fxu_MatrixPrint( stdout, p );
    return p;
}